

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.cxx
# Opt level: O2

bool __thiscall
cmTargetIncludeDirectoriesCommand::HandleDirectContent
          (cmTargetIncludeDirectoriesCommand *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool system)

{
  bool bVar1;
  char *__lhs;
  size_type sVar2;
  pointer input;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sdirs;
  string prefix;
  cmListFileBacktrace lfbt;
  undefined1 local_c0 [32];
  _Base_ptr local_a0;
  size_t local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  cmListFileBacktrace local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cmMakefile::GetBacktrace(&local_70,(this->super_cmTargetPropCommandBase).super_cmCommand.Makefile)
  ;
  (*(this->super_cmTargetPropCommandBase).super_cmCommand._vptr_cmCommand[0xb])
            (local_c0,this,content);
  cmTarget::InsertInclude(tgt,(string *)local_c0,&local_70,prepend);
  std::__cxx11::string::~string((string *)local_c0);
  if (system) {
    __lhs = cmMakefile::GetCurrentSourceDirectory
                      ((this->super_cmTargetPropCommandBase).super_cmCommand.Makefile);
    std::__cxx11::string::string((string *)local_c0,"/",(allocator *)&local_50);
    std::operator+(&local_90,__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    std::__cxx11::string::~string((string *)local_c0);
    local_c0._24_8_ = local_c0 + 8;
    local_c0._8_4_ = _S_red;
    local_c0._16_8_ = 0;
    local_98 = 0;
    local_a0 = (_Base_ptr)local_c0._24_8_;
    for (input = (content->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        input != (content->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish; input = input + 1) {
      bVar1 = cmsys::SystemTools::FileIsFullPath((input->_M_dataplus)._M_p);
      if (bVar1) {
LAB_00401a2d:
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_c0,input);
      }
      else {
        sVar2 = cmGeneratorExpression::Find(input);
        if (sVar2 == 0) goto LAB_00401a2d;
        std::operator+(&local_50,&local_90,input);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_c0,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    cmTarget::AddSystemIncludeDirectories
              (tgt,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_c0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  cmListFileBacktrace::~cmListFileBacktrace(&local_70);
  return true;
}

Assistant:

bool cmTargetIncludeDirectoriesCommand::HandleDirectContent(
  cmTarget* tgt, const std::vector<std::string>& content, bool prepend,
  bool system)
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  tgt->InsertInclude(this->Join(content), lfbt, prepend);
  if (system) {
    std::string prefix =
      this->Makefile->GetCurrentSourceDirectory() + std::string("/");
    std::set<std::string> sdirs;
    for (std::vector<std::string>::const_iterator it = content.begin();
         it != content.end(); ++it) {
      if (cmSystemTools::FileIsFullPath(it->c_str()) ||
          cmGeneratorExpression::Find(*it) == 0) {
        sdirs.insert(*it);
      } else {
        sdirs.insert(prefix + *it);
      }
    }
    tgt->AddSystemIncludeDirectories(sdirs);
  }
  return true;
}